

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParallelExecutionTests.cpp
# Opt level: O0

void __thiscall
agge::tests::ParallelExecutionTests::CallsInSingleThreadedObjectAreMadeInTheCurrentThread
          (ParallelExecutionTests *this)

{
  reference ppVar1;
  allocator local_2d1;
  string local_2d0 [32];
  LocationInfo local_2b0;
  thread_id local_288;
  allocator local_279;
  string local_278 [32];
  LocationInfo local_258;
  uint local_230;
  allocator local_229;
  string local_228 [32];
  LocationInfo local_208;
  size_type local_1e0;
  uint local_1d8;
  allocator local_1d1;
  string local_1d0 [32];
  LocationInfo local_1b0;
  thread_id local_188;
  allocator local_179;
  string local_178 [32];
  LocationInfo local_158;
  uint local_130;
  allocator local_129;
  string local_128 [32];
  LocationInfo local_108;
  size_type local_e0;
  uint local_d4;
  undefined1 local_d0 [8];
  thread_capture tc;
  mutex mtx;
  undefined1 local_48 [8];
  log_container log;
  parallel p;
  ParallelExecutionTests *this_local;
  
  parallel::parallel((parallel *)
                     &log.
                      super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
  std::
  vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
            *)local_48);
  mutex::mutex((mutex *)&tc._mutex);
  thread_capture::thread_capture
            ((thread_capture *)local_d0,(log_container *)local_48,(mutex *)&tc._mutex);
  parallel::call((parallel *)
                 &log.
                  super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(kernel_function *)local_d0);
  local_d4 = 1;
  local_e0 = std::
             vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
             ::size((vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                     *)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_128,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ParallelExecutionTests.cpp"
             ,&local_129);
  ut::LocationInfo::LocationInfo(&local_108,(string *)local_128,0x4b);
  ut::are_equal<unsigned_int,unsigned_long>(&local_d4,&local_e0,&local_108);
  ut::LocationInfo::~LocationInfo(&local_108);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  local_130 = 0;
  ppVar1 = std::
           vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
           ::operator[]((vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                         *)local_48,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_178,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ParallelExecutionTests.cpp"
             ,&local_179);
  ut::LocationInfo::LocationInfo(&local_158,(string *)local_178,0x4c);
  ut::are_equal<unsigned_int,unsigned_int>(&local_130,&ppVar1->first,&local_158);
  ut::LocationInfo::~LocationInfo(&local_158);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  local_188 = this_thread_id();
  ppVar1 = std::
           vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
           ::operator[]((vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                         *)local_48,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1d0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ParallelExecutionTests.cpp"
             ,&local_1d1);
  ut::LocationInfo::LocationInfo(&local_1b0,(string *)local_1d0,0x4d);
  ut::are_equal<unsigned_long,unsigned_long>(&local_188,&ppVar1->second,&local_1b0);
  ut::LocationInfo::~LocationInfo(&local_1b0);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  parallel::call((parallel *)
                 &log.
                  super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(kernel_function *)local_d0);
  local_1d8 = 2;
  local_1e0 = std::
              vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
              ::size((vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                      *)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_228,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ParallelExecutionTests.cpp"
             ,&local_229);
  ut::LocationInfo::LocationInfo(&local_208,(string *)local_228,0x53);
  ut::are_equal<unsigned_int,unsigned_long>(&local_1d8,&local_1e0,&local_208);
  ut::LocationInfo::~LocationInfo(&local_208);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  local_230 = 0;
  ppVar1 = std::
           vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
           ::operator[]((vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                         *)local_48,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_278,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ParallelExecutionTests.cpp"
             ,&local_279);
  ut::LocationInfo::LocationInfo(&local_258,(string *)local_278,0x54);
  ut::are_equal<unsigned_int,unsigned_int>(&local_230,&ppVar1->first,&local_258);
  ut::LocationInfo::~LocationInfo(&local_258);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  local_288 = this_thread_id();
  ppVar1 = std::
           vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
           ::operator[]((vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                         *)local_48,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2d0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ParallelExecutionTests.cpp"
             ,&local_2d1);
  ut::LocationInfo::LocationInfo(&local_2b0,(string *)local_2d0,0x55);
  ut::are_equal<unsigned_long,unsigned_long>(&local_288,&ppVar1->second,&local_2b0);
  ut::LocationInfo::~LocationInfo(&local_2b0);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  mutex::~mutex((mutex *)&tc._mutex);
  std::
  vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
  ::~vector((vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
             *)local_48);
  parallel::~parallel((parallel *)
                      &log.
                       super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

test( CallsInSingleThreadedObjectAreMadeInTheCurrentThread )
			{
				// INIT
				parallel p(1);
				thread_capture::log_container log;
				mutex mtx;
				thread_capture tc(log, mtx);

				// ACT
				p.call(tc);

				// ASSERT
				assert_equal(1u, log.size());
				assert_equal(0u, log[0].first);
				assert_equal(this_thread_id(), log[0].second);

				// ACT
				p.call(tc);

				// ASSERT
				assert_equal(2u, log.size());
				assert_equal(0u, log[1].first);
				assert_equal(this_thread_id(), log[1].second);
			}